

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O0

void __thiscall
pbrt::SurfaceInteraction::SetShadingGeometry
          (SurfaceInteraction *this,Normal3f *ns,Vector3f *dpdus,Vector3f *dpdvs,Normal3f *dndus,
          Normal3f *dndvs,bool orientationIsAuthoritative)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  float fVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Normal3<float> NVar7;
  byte in_stack_00000008;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 auVar6 [56];
  
  auVar6 = in_ZMM0._8_56_;
  *(undefined8 *)(in_RDI + 0x80) = *in_RSI;
  *(undefined4 *)(in_RDI + 0x88) = *(undefined4 *)(in_RSI + 1);
  if ((in_stack_00000008 & 1) == 0) {
    NVar7 = FaceForward<float>((Normal3<float> *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               (Normal3<float> *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    auVar5._0_8_ = NVar7.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    uVar1 = vmovlpd_avx(auVar5._0_16_);
    *(undefined8 *)(in_RDI + 0x80) = uVar1;
    *(float *)(in_RDI + 0x88) = NVar7.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  else {
    NVar7 = FaceForward<float>((Normal3<float> *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               (Normal3<float> *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    auVar4._0_8_ = NVar7.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar4._8_56_ = auVar6;
    uVar1 = vmovlpd_avx(auVar4._0_16_);
    *(undefined8 *)(in_RDI + 0x28) = uVar1;
    *(float *)(in_RDI + 0x30) = NVar7.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  *(undefined8 *)(in_RDI + 0x8c) = *in_RDX;
  *(undefined4 *)(in_RDI + 0x94) = *(undefined4 *)(in_RDX + 1);
  *(undefined8 *)(in_RDI + 0x98) = *in_RCX;
  *(undefined4 *)(in_RDI + 0xa0) = *(undefined4 *)(in_RCX + 1);
  *(undefined8 *)(in_RDI + 0xa4) = *in_R8;
  *(undefined4 *)(in_RDI + 0xac) = *(undefined4 *)(in_R8 + 1);
  *(undefined8 *)(in_RDI + 0xb0) = *in_R9;
  *(undefined4 *)(in_RDI + 0xb8) = *(undefined4 *)(in_R9 + 1);
  while( true ) {
    fVar3 = LengthSquared<float>((Vector3<float> *)(in_RDI + 0x8c));
    bVar2 = true;
    if (fVar3 <= 1e+16) {
      fVar3 = LengthSquared<float>((Vector3<float> *)(in_RDI + 0x98));
      bVar2 = 1e+16 < fVar3;
    }
    if (!bVar2) break;
    Tuple3<pbrt::Vector3,float>::operator/=((Tuple3<pbrt::Vector3,float> *)(in_RDI + 0x8c),1e+08);
    Tuple3<pbrt::Vector3,float>::operator/=((Tuple3<pbrt::Vector3,float> *)(in_RDI + 0x98),1e+08);
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void SetShadingGeometry(const Normal3f &ns, const Vector3f &dpdus,
                            const Vector3f &dpdvs, const Normal3f &dndus,
                            const Normal3f &dndvs, bool orientationIsAuthoritative) {
        // Compute _shading.n_ for _SurfaceInteraction_
        shading.n = ns;
        DCHECK_NE(shading.n, Normal3f(0, 0, 0));
        if (orientationIsAuthoritative)
            n = FaceForward(n, shading.n);
        else
            shading.n = FaceForward(shading.n, n);

        // Initialize _shading_ partial derivative values
        shading.dpdu = dpdus;
        shading.dpdv = dpdvs;
        shading.dndu = dndus;
        shading.dndv = dndvs;
        while (LengthSquared(shading.dpdu) > 1e16f ||
               LengthSquared(shading.dpdv) > 1e16f) {
            shading.dpdu /= 1e8f;
            shading.dpdv /= 1e8f;
        }
    }